

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityDestinationRecord *this)

{
  ostream *poVar1;
  ulong uVar2;
  ushort uVar3;
  KStringStream ss;
  char local_381;
  KString local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Entity Destination Record\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Entity ID:\n",0xb);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_380,&this->m_Entity);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_381 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
  if (local_380._M_string_length != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_381 = local_380._M_dataplus._M_p[uVar2];
      if ((local_380._M_string_length - 1 == uVar2) || (local_381 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
        local_381 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < local_380._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_360,local_358)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Device ID:           ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nLine ID:             ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nPriority:            ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nLine State Command:  ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityDestinationRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Destination Record\n"
       << "Entity ID:\n"          << IndentString( m_Entity.GetAsString(), 1 )
       << "Device ID:           " << m_ui16DstCommsDvcID
       << "\nLine ID:             " << ( KUINT16 )m_ui8DstLineID
       << "\nPriority:            " << ( KUINT16 )m_ui8DstPriority
       << "\nLine State Command:  " << ( KUINT16 )m_ui8LnStCmd
       << "\n";

    return ss.str();
}